

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericData.hpp
# Opt level: O0

void __thiscall
OpenMD::SimpleTypeData<OpenMD::Restraint_*>::~SimpleTypeData
          (SimpleTypeData<OpenMD::Restraint_*> *this)

{
  void *in_RDI;
  
  ~SimpleTypeData((SimpleTypeData<OpenMD::Restraint_*> *)0x1b74c8);
  operator_delete(in_RDI,0x30);
  return;
}

Assistant:

SimpleTypeData(const std::string& id) :
        GenericData(id), data_(ElemDataType()) {}